

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_meth_message_type(parser *p)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  char *name;
  blow_method *meth;
  char *type;
  wchar_t msg_index;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("meth",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0xa0,"enum parser_error parse_meth_message_type(struct parser *)");
  }
  _Var1 = parser_hasval(p,"msg");
  if (_Var1) {
    name = parser_getstr(p,"msg");
    iVar2 = message_lookup_by_name(name);
    if (iVar2 < 0) {
      return PARSE_ERROR_INVALID_MESSAGE;
    }
    *(int *)((long)pvVar3 + 0xc) = iVar2;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_meth_message_type(struct parser *p)
{
	int msg_index;
	const char *type;
	struct blow_method *meth = parser_priv(p);
	assert(meth);

	if (parser_hasval(p, "msg")) {
		type = parser_getstr(p, "msg");

		msg_index = message_lookup_by_name(type);

		if (msg_index < 0)
			return PARSE_ERROR_INVALID_MESSAGE;

		meth->msgt = msg_index;
	}
	return PARSE_ERROR_NONE;
}